

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

bool __thiscall
Lib::
DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash,_Lib::DefaultHash2>
::insert(DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
        AbstractOptionValue *val)

{
  Entry *pEVar1;
  AbstractOptionValue *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_RDI;
  bool bVar2;
  bool exists;
  Entry *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_00;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *this_00;
  
  key_00 = in_RSI;
  this_00 = in_RDI;
  ensureExpanded(in_RDI);
  pEVar1 = findEntryToInsert(this_00,key_00);
  bVar2 = false;
  if ((uint)(pEVar1->field_0)._infoData >> 2 == in_RDI->_timestamp) {
    bVar2 = ((pEVar1->field_0)._infoData & 1U) == 0;
  }
  if (!bVar2) {
    if ((uint)(pEVar1->field_0)._infoData >> 2 == in_RDI->_timestamp) {
      in_RDI->_deleted = in_RDI->_deleted + -1;
    }
    else {
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 3U | in_RDI->_timestamp << 2;
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffd;
    }
    (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffe;
    std::__cxx11::string::operator=((string *)&pEVar1->_key,(string *)in_RSI);
    pEVar1->_val = in_RDX;
    in_RDI->_size = in_RDI->_size + 1;
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool insert(Key key, Val val)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key = std::move(key);
      e->_val = std::move(val);
      _size++;
    }
    return !exists;

  }